

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall Logger::writeLog(Logger *this,LogLevel level,string *date,string *message)

{
  char cVar1;
  ostream *poVar2;
  
  needCreateNewLogFile(this);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    poVar2 = std::operator<<((ostream *)&this->logfp,"[");
    poVar2 = std::operator<<(poVar2,(string *)date);
    if ((int)level < 6) {
      poVar2 = std::operator<<(poVar2,"] [");
      poVar2 = std::operator<<(poVar2,(string *)(LogLevelNames_abi_cxx11_ + level));
    }
    poVar2 = std::operator<<(poVar2,"] ");
    poVar2 = std::operator<<(poVar2,(string *)message);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ostream::flush();
  }
  if (this->outputToTerminal == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[");
    poVar2 = std::operator<<(poVar2,(string *)date);
    if ((int)level < 6) {
      poVar2 = std::operator<<(poVar2,"] [");
      poVar2 = std::operator<<(poVar2,(string *)(LogLevelColors_abi_cxx11_ + level));
      poVar2 = std::operator<<(poVar2,(string *)(LogLevelNames_abi_cxx11_ + level));
      poVar2 = std::operator<<(poVar2,(string *)&LogLevelReset_abi_cxx11_);
    }
    poVar2 = std::operator<<(poVar2,"] ");
    poVar2 = std::operator<<(poVar2,(string *)message);
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  return;
}

Assistant:

inline void writeLog(LogLevel level, const std::string date, const std::string& message)  // 写入日志
    {
        needCreateNewLogFile();
#if defined(_WIN32) || defined(_WIN64)
        if (logFileHandle!= INVALID_HANDLE_VALUE) {      // 输出到文件
            if(level < LV_CLOSE) {
                std::string logMessage = "[" + date + "] [" + LogLevelNames[level] + "] " + message + "\r\n";
                DWORD bytesWritten = 0;
                WriteFile(logFileHandle, logMessage.c_str(), logMessage.length(), &bytesWritten, NULL);  
            }
        }
        if (outputToTerminal) {     // 输出到终端
            if(level < LV_CLOSE) std::cout << "[" << date << "] [" << LogLevelNames[level] << "] " << message << std::endl;
            else std::cout << "[" << date << "] " << message << std::endl;
        }
#else
        if (logfp.is_open()) {      // 输出到文件
            if(level < LV_CLOSE) logfp << "[" << date << "] [" << LogLevelNames[level] << "] " << message << std::endl;
            else logfp << "[" << date << "] " << message << std::endl;
            logfp.flush();
        }
        if (outputToTerminal) {     // 输出到终端
            if(level < LV_CLOSE) std::cout << "[" << date << "] [" << LogLevelColors[level] << LogLevelNames[level] << LogLevelReset << "] " << message << std::endl;
            else std::cout << "[" << date << "] " << message << std::endl;
        }
#endif 
    }